

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O1

void __thiscall xLearn::MODEL_TEST_BestModel_Test::TestBody(MODEL_TEST_BestModel_Test *this)

{
  real_t *prVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  byte bVar17;
  real_t *prVar18;
  float *pfVar19;
  real_t *__s;
  real_t *__s_00;
  bool bVar20;
  ulong uVar21;
  char *pcVar22;
  ushort uVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  AssertionResult gtest_ar;
  Model model_ffm;
  HyperParam hyper_param;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  AssertHelper local_2f0;
  internal local_2e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  float *local_2d8;
  Model local_2d0;
  HyperParam local_240;
  
  Init();
  local_2d0.score_func_._M_dataplus._M_p = (pointer)&local_2d0.score_func_.field_2;
  local_2d0.score_func_._M_string_length = 0;
  local_2d0.score_func_.field_2._M_local_buf[0] = '\0';
  local_2d0.loss_func_._M_dataplus._M_p = (pointer)&local_2d0.loss_func_.field_2;
  local_2d0.loss_func_._M_string_length = 0;
  local_2d0.loss_func_.field_2._M_local_buf[0] = '\0';
  local_2d0.param_w_ = (real_t *)0x0;
  local_2d0.param_v_ = (real_t *)0x0;
  local_2d0.param_b_ = (float *)0x0;
  local_2d0.param_best_w_ = (real_t *)0x0;
  local_2d0.param_best_v_ = (real_t *)0x0;
  local_2d0.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&local_2d0,&local_240.score_func,&local_240.loss_func,local_240.num_feature,
                    local_240.num_field,local_240.num_K,2,1.0);
  prVar18 = local_2d0.param_b_;
  __s_00 = local_2d0.param_v_;
  __s = local_2d0.param_w_;
  if ((ulong)local_2d0.param_num_w_ != 0) {
    auVar24 = vpbroadcastq_avx512f();
    uVar21 = 0;
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar27 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    do {
      auVar28 = vpbroadcastq_avx512f();
      auVar29 = vporq_avx512f(auVar28,auVar25);
      auVar28 = vporq_avx512f(auVar28,auVar26);
      uVar15 = vpcmpuq_avx512f(auVar28,auVar24,2);
      uVar16 = vpcmpuq_avx512f(auVar29,auVar24,2);
      bVar17 = (byte)uVar16;
      uVar23 = CONCAT11(bVar17,(byte)uVar15);
      prVar1 = local_2d0.param_w_ + uVar21;
      bVar20 = (bool)((byte)uVar15 & 1);
      bVar2 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar23 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar23 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar23 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar23 >> 7) & 1);
      bVar9 = (bool)(bVar17 >> 1 & 1);
      bVar10 = (bool)(bVar17 >> 2 & 1);
      bVar11 = (bool)(bVar17 >> 3 & 1);
      bVar12 = (bool)(bVar17 >> 4 & 1);
      bVar13 = (bool)(bVar17 >> 5 & 1);
      bVar14 = (bool)(bVar17 >> 6 & 1);
      *prVar1 = (real_t)((uint)bVar20 * auVar27._0_4_ | (uint)!bVar20 * (int)*prVar1);
      prVar1[1] = (real_t)((uint)bVar2 * auVar27._4_4_ | (uint)!bVar2 * (int)prVar1[1]);
      prVar1[2] = (real_t)((uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * (int)prVar1[2]);
      prVar1[3] = (real_t)((uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * (int)prVar1[3]);
      prVar1[4] = (real_t)((uint)bVar5 * auVar27._16_4_ | (uint)!bVar5 * (int)prVar1[4]);
      prVar1[5] = (real_t)((uint)bVar6 * auVar27._20_4_ | (uint)!bVar6 * (int)prVar1[5]);
      prVar1[6] = (real_t)((uint)bVar7 * auVar27._24_4_ | (uint)!bVar7 * (int)prVar1[6]);
      prVar1[7] = (real_t)((uint)bVar8 * auVar27._28_4_ | (uint)!bVar8 * (int)prVar1[7]);
      prVar1[8] = (real_t)((uint)(bVar17 & 1) * auVar27._32_4_ |
                          (uint)!(bool)(bVar17 & 1) * (int)prVar1[8]);
      prVar1[9] = (real_t)((uint)bVar9 * auVar27._36_4_ | (uint)!bVar9 * (int)prVar1[9]);
      prVar1[10] = (real_t)((uint)bVar10 * auVar27._40_4_ | (uint)!bVar10 * (int)prVar1[10]);
      prVar1[0xb] = (real_t)((uint)bVar11 * auVar27._44_4_ | (uint)!bVar11 * (int)prVar1[0xb]);
      prVar1[0xc] = (real_t)((uint)bVar12 * auVar27._48_4_ | (uint)!bVar12 * (int)prVar1[0xc]);
      prVar1[0xd] = (real_t)((uint)bVar13 * auVar27._52_4_ | (uint)!bVar13 * (int)prVar1[0xd]);
      prVar1[0xe] = (real_t)((uint)bVar14 * auVar27._56_4_ | (uint)!bVar14 * (int)prVar1[0xe]);
      prVar1[0xf] = (real_t)((uint)(bVar17 >> 7) * auVar27._60_4_ |
                            (uint)!(bool)(bVar17 >> 7) * (int)prVar1[0xf]);
      uVar21 = uVar21 + 0x10;
    } while (((ulong)local_2d0.param_num_w_ + 0xf & 0x1fffffff0) != uVar21);
  }
  if ((ulong)local_2d0.param_num_v_ != 0) {
    auVar24 = vpbroadcastq_avx512f();
    uVar21 = 0;
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar27 = vbroadcastss_avx512f(ZEXT416(0x40000000));
    do {
      auVar28 = vpbroadcastq_avx512f();
      auVar29 = vporq_avx512f(auVar28,auVar25);
      auVar28 = vporq_avx512f(auVar28,auVar26);
      uVar15 = vpcmpuq_avx512f(auVar28,auVar24,2);
      uVar16 = vpcmpuq_avx512f(auVar29,auVar24,2);
      bVar17 = (byte)uVar16;
      uVar23 = CONCAT11(bVar17,(byte)uVar15);
      prVar1 = local_2d0.param_v_ + uVar21;
      bVar20 = (bool)((byte)uVar15 & 1);
      bVar2 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar23 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar23 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar23 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar23 >> 7) & 1);
      bVar9 = (bool)(bVar17 >> 1 & 1);
      bVar10 = (bool)(bVar17 >> 2 & 1);
      bVar11 = (bool)(bVar17 >> 3 & 1);
      bVar12 = (bool)(bVar17 >> 4 & 1);
      bVar13 = (bool)(bVar17 >> 5 & 1);
      bVar14 = (bool)(bVar17 >> 6 & 1);
      *prVar1 = (real_t)((uint)bVar20 * auVar27._0_4_ | (uint)!bVar20 * (int)*prVar1);
      prVar1[1] = (real_t)((uint)bVar2 * auVar27._4_4_ | (uint)!bVar2 * (int)prVar1[1]);
      prVar1[2] = (real_t)((uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * (int)prVar1[2]);
      prVar1[3] = (real_t)((uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * (int)prVar1[3]);
      prVar1[4] = (real_t)((uint)bVar5 * auVar27._16_4_ | (uint)!bVar5 * (int)prVar1[4]);
      prVar1[5] = (real_t)((uint)bVar6 * auVar27._20_4_ | (uint)!bVar6 * (int)prVar1[5]);
      prVar1[6] = (real_t)((uint)bVar7 * auVar27._24_4_ | (uint)!bVar7 * (int)prVar1[6]);
      prVar1[7] = (real_t)((uint)bVar8 * auVar27._28_4_ | (uint)!bVar8 * (int)prVar1[7]);
      prVar1[8] = (real_t)((uint)(bVar17 & 1) * auVar27._32_4_ |
                          (uint)!(bool)(bVar17 & 1) * (int)prVar1[8]);
      prVar1[9] = (real_t)((uint)bVar9 * auVar27._36_4_ | (uint)!bVar9 * (int)prVar1[9]);
      prVar1[10] = (real_t)((uint)bVar10 * auVar27._40_4_ | (uint)!bVar10 * (int)prVar1[10]);
      prVar1[0xb] = (real_t)((uint)bVar11 * auVar27._44_4_ | (uint)!bVar11 * (int)prVar1[0xb]);
      prVar1[0xc] = (real_t)((uint)bVar12 * auVar27._48_4_ | (uint)!bVar12 * (int)prVar1[0xc]);
      prVar1[0xd] = (real_t)((uint)bVar13 * auVar27._52_4_ | (uint)!bVar13 * (int)prVar1[0xd]);
      prVar1[0xe] = (real_t)((uint)bVar14 * auVar27._56_4_ | (uint)!bVar14 * (int)prVar1[0xe]);
      prVar1[0xf] = (real_t)((uint)(bVar17 >> 7) * auVar27._60_4_ |
                            (uint)!(bool)(bVar17 >> 7) * (int)prVar1[0xf]);
      uVar21 = uVar21 + 0x10;
    } while (((ulong)local_2d0.param_num_v_ + 0xf & 0x1fffffff0) != uVar21);
  }
  prVar18[0] = 3.0;
  prVar18[1] = 3.0;
  Model::SetBestModel(&local_2d0);
  if ((ulong)local_2d0.param_num_w_ != 0) {
    memset(__s,0,(ulong)local_2d0.param_num_w_ << 2);
  }
  if ((ulong)local_2d0.param_num_v_ != 0) {
    memset(__s_00,0,(ulong)local_2d0.param_num_v_ << 2);
  }
  prVar18[0] = 0.0;
  prVar18[1] = 0.0;
  Model::Shrink(&local_2d0);
  local_2d8 = prVar18;
  if (local_2d0.param_num_w_ != 0) {
    uVar21 = 0;
    do {
      testing::internal::CmpHelperFloatingPointEQ<float>(local_2e8,"w[i]","1",__s[uVar21],1.0);
      if (local_2e8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_2f8);
        pcVar22 = "";
        if (local_2e0.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar22 = ((local_2e0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x10f,pcVar22);
        testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
        testing::internal::AssertHelper::~AssertHelper(&local_2f0);
        if (local_2f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar20 = testing::internal::IsTrue(true);
          if ((bVar20) &&
             (local_2f8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_2f8.ptr_ + 8))();
          }
          local_2f8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar21 = uVar21 + 1;
    } while (uVar21 < local_2d0.param_num_w_);
  }
  if (local_2d0.param_num_v_ != 0) {
    uVar21 = 0;
    do {
      testing::internal::CmpHelperFloatingPointEQ<float>(local_2e8,"v[i]","2",__s_00[uVar21],2.0);
      if (local_2e8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_2f8);
        pcVar22 = "";
        if (local_2e0.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar22 = ((local_2e0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x112,pcVar22);
        testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
        testing::internal::AssertHelper::~AssertHelper(&local_2f0);
        if (local_2f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar20 = testing::internal::IsTrue(true);
          if ((bVar20) &&
             (local_2f8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_2f8.ptr_ + 8))();
          }
          local_2f8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar21 = uVar21 + 1;
    } while (uVar21 < local_2d0.param_num_v_);
  }
  pfVar19 = local_2d8;
  testing::internal::CmpHelperFloatingPointEQ<float>(local_2e8,"b[0]","3",*local_2d8,3.0);
  if (local_2e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_2e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar22 = "";
    }
    else {
      pcVar22 = ((local_2e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x114,pcVar22);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if (local_2f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar20 = testing::internal::IsTrue(true);
      if ((bVar20) &&
         (local_2f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2f8.ptr_ + 8))();
      }
      local_2f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<float>(local_2e8,"b[1]","3",pfVar19[1],3.0);
  if (local_2e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_2e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar22 = "";
    }
    else {
      pcVar22 = ((local_2e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x115,pcVar22);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if (local_2f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar20 = testing::internal::IsTrue(true);
      if ((bVar20) &&
         (local_2f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2f8.ptr_ + 8))();
      }
      local_2f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Model::~Model(&local_2d0);
  HyperParam::~HyperParam(&local_240);
  return;
}

Assistant:

TEST(MODEL_TEST, BestModel) {
  // Init model
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K, 2);
  real_t* w = model_ffm.GetParameter_w();
  real_t* v = model_ffm.GetParameter_v();
  real_t* b = model_ffm.GetParameter_b();
  // Set best model
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    w[i] = 1;
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    v[i] = 2;
  }
  b[0] = 3;
  b[1] = 3;
  model_ffm.SetBestModel();
  // Shrink bacj
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    w[i] = 0;
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    v[i] = 0;
  }
  b[0] = 0;
  b[1] = 0;
  model_ffm.Shrink();
  // Test
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    EXPECT_FLOAT_EQ(w[i], 1);
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    EXPECT_FLOAT_EQ(v[i], 2);
  }
  EXPECT_FLOAT_EQ(b[0], 3);
  EXPECT_FLOAT_EQ(b[1], 3);
}